

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

entry_type __thiscall fasttext::Dictionary::getType(Dictionary *this,string_view w)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  element_type *peVar1;
  size_type sVar2;
  size_type in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1a76fd);
  __str = (basic_string_view<char,_std::char_traits<char>_>)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)&peVar1->label);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_ffffffffffffffd7,
                              CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)),__str,
                     in_stack_ffffffffffffffc8);
  return sVar2 == 0;
}

Assistant:

entry_type Dictionary::getType(const std::string_view w) const {
  return (w.find(args_->label) == 0) ? entry_type::label : entry_type::word;
}